

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::createPort
          (AnsiPortListBuilder *this,ImplicitAnsiPortSyntax *syntax)

{
  SyntaxKind SVar1;
  Token token;
  Token token_00;
  Token token_01;
  string_view arg;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs;
  string_view modport_00;
  string_view modport_01;
  string_view modport_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_02;
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_04;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_05;
  string_view lookupName;
  bool bVar2;
  ArgumentDirection AVar3;
  PortHeaderSyntax *pPVar4;
  SyntaxNode *pSVar5;
  Symbol *pSVar6;
  DefinitionSymbol *this_00;
  DataTypeSyntax *pDVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  InterfacePortHeaderSyntax *pIVar9;
  __tuple_element_t<0UL,_tuple<const_DefinitionSymbol_*,_basic_string_view<char,_char_traits<char>_>_>_>
  *ppDVar10;
  long in_RDI;
  bitmask<slang::ast::LookupFlags> unaff_retaddr;
  string_view in_stack_00000008;
  type *modport;
  type *definition;
  string_view modport_1;
  InterfacePortHeaderSyntax *header_2;
  NetPortHeaderSyntax *header_1;
  NetType *netType;
  ArgumentDirection direction;
  Diagnostic *diag;
  DefinitionSymbol *defSym;
  Symbol *def;
  Symbol *found;
  string_view simpleName;
  VariablePortHeaderSyntax *header;
  DeclaratorSyntax *decl;
  anon_class_1_0_00000001 isEmpty;
  size_t in_stack_fffffffffffffcf8;
  Diagnostic *in_stack_fffffffffffffd00;
  SourceLocation in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  DiagCode in_stack_fffffffffffffd14;
  SourceLocation in_stack_fffffffffffffd18;
  Diagnostic *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  SyntaxNode *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  undefined1 isGeneric;
  DefinitionSymbol *in_stack_fffffffffffffd60;
  DeclaratorSyntax *in_stack_fffffffffffffd68;
  DeclaratorSyntax *decl_00;
  AnsiPortListBuilder *in_stack_fffffffffffffd70;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  TokenKind kind;
  Compilation *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  Scope *in_stack_fffffffffffffda0;
  SourceLocation location;
  undefined8 in_stack_fffffffffffffdb0;
  DiagCode code;
  Scope *local_1d0;
  SourceLocation in_stack_fffffffffffffe40;
  SourceLocation in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  DiagCode code_00;
  DeclaratorSyntax *in_stack_fffffffffffffe58;
  AnsiPortListBuilder *in_stack_fffffffffffffe60;
  pointer in_stack_fffffffffffffe70;
  Info *pIVar11;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Scope *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Compilation *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  int *local_b0;
  bitmask<slang::ast::LookupFlags> local_6c;
  size_t local_68;
  char *local_60;
  Symbol *local_58;
  string_view local_50 [2];
  VariablePortHeaderSyntax *local_30;
  DeclaratorSyntax *local_28;
  undefined1 local_19;
  Scope *in_stack_fffffffffffffff8;
  
  kind = (TokenKind)((ulong)in_stack_fffffffffffffd88 >> 0x30);
  isGeneric = (undefined1)((ulong)in_stack_fffffffffffffd58 >> 0x38);
  code_00 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
  code = SUB84((ulong)in_stack_fffffffffffffdb0 >> 0x20,0);
  local_19 = 0;
  local_28 = not_null<slang::syntax::DeclaratorSyntax_*>::operator*
                       ((not_null<slang::syntax::DeclaratorSyntax_*> *)0x4652a0);
  pPVar4 = not_null<slang::syntax::PortHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::PortHeaderSyntax_*> *)0x4652b9);
  SVar1 = (pPVar4->super_SyntaxNode).kind;
  if (SVar1 == InterfacePortHeader) {
    pSVar5 = &not_null<slang::syntax::PortHeaderSyntax_*>::operator->
                        ((not_null<slang::syntax::PortHeaderSyntax_*> *)0x465b24)->super_SyntaxNode;
    pIVar9 = slang::syntax::SyntaxNode::as<slang::syntax::InterfacePortHeaderSyntax>(pSVar5);
    if ((pIVar9->nameOrKeyword).kind == InterfaceKeyword) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe40);
      if (pIVar9->modport != (DotMemberClauseSyntax *)0x0) {
        parsing::Token::valueText
                  ((Token *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      }
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd08);
      modport_01._M_str = in_stack_fffffffffffffd80;
      modport_01._M_len = in_stack_fffffffffffffd78._M_extent_value;
      attrs_01._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffd98;
      attrs_01._M_ptr = (pointer)in_stack_fffffffffffffd90;
      attrs_01._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffd9c;
      pSVar6 = add(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                   modport_01,(bool)isGeneric,attrs_01);
    }
    else {
      getInterfacePortInfo
                (in_stack_fffffffffffffef8,
                 (InterfacePortHeaderSyntax *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ppDVar10 = std::
                 get<0ul,slang::ast::DefinitionSymbol_const*,std::basic_string_view<char,std::char_traits<char>>>
                           ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)0x465c6e);
      std::
      get<1ul,slang::ast::DefinitionSymbol_const*,std::basic_string_view<char,std::char_traits<char>>>
                ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)0x465c83);
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)*ppDVar10,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_28);
      modport_02._M_str = in_stack_fffffffffffffd80;
      modport_02._M_len = in_stack_fffffffffffffd78._M_extent_value;
      attrs_02._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffd98;
      attrs_02._M_ptr = (pointer)in_stack_fffffffffffffd90;
      attrs_02._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffd9c;
      pSVar6 = add(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                   modport_02,(bool)isGeneric,attrs_02);
    }
  }
  else if (SVar1 == NetPortHeader) {
    pSVar5 = &not_null<slang::syntax::PortHeaderSyntax_*>::operator->
                        ((not_null<slang::syntax::PortHeaderSyntax_*> *)0x465a1d)->super_SyntaxNode;
    _Var8._M_extent_value =
         (size_t)slang::syntax::SyntaxNode::as<slang::syntax::NetPortHeaderSyntax>(pSVar5);
    pIVar11 = (((NetPortHeaderSyntax *)_Var8._M_extent_value)->direction).info;
    token_01.info._0_4_ = in_stack_fffffffffffffd10;
    token_01._0_8_ = in_stack_fffffffffffffd08;
    token_01.info._4_4_ = in_stack_fffffffffffffd14;
    getDirection((AnsiPortListBuilder *)in_stack_fffffffffffffd00,token_01);
    not_null::operator_cast_to_DataTypeSyntax_
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x465a8c);
    Compilation::getNetType(in_stack_fffffffffffffd90,kind);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd08);
    attrs_05._M_extent._M_extent_value = _Var8._M_extent_value;
    attrs_05._M_ptr = (pointer)pIVar11;
    pSVar6 = add(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(ArgumentDirection)code_00,
                 (DataTypeSyntax *)in_stack_fffffffffffffe48,(NetType *)in_stack_fffffffffffffe40,
                 attrs_05);
  }
  else {
    pSVar5 = &not_null<slang::syntax::PortHeaderSyntax_*>::operator->
                        ((not_null<slang::syntax::PortHeaderSyntax_*> *)0x4652f4)->super_SyntaxNode;
    local_30 = slang::syntax::SyntaxNode::as<slang::syntax::VariablePortHeaderSyntax>(pSVar5);
    bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x465315);
    if ((!bVar2) && (bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x46532e), !bVar2)) {
      not_null<slang::syntax::DataTypeSyntax_*>::operator*
                ((not_null<slang::syntax::DataTypeSyntax_*> *)0x465347);
      bVar2 = createPort::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_fffffffffffffd08,
                         (DataTypeSyntax *)in_stack_fffffffffffffd00);
      if (bVar2) {
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd08);
        attrs._M_extent._M_extent_value = in_stack_fffffffffffffd78._M_extent_value;
        attrs._M_ptr = (pointer)in_stack_fffffffffffffd70;
        pSVar6 = addInherited((AnsiPortListBuilder *)in_stack_fffffffffffffd68,
                              (DeclaratorSyntax *)in_stack_fffffffffffffd60,attrs);
        return pSVar6;
      }
    }
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x4653c9);
    local_50[0] = slang::syntax::SyntaxFacts::getSimpleTypeName
                            ((DataTypeSyntax *)in_stack_fffffffffffffd00);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_50);
    if (!bVar2) {
      location = *(SourceLocation *)(in_RDI + 8);
      local_68 = local_50[0]._M_len;
      local_60 = local_50[0]._M_str;
      bitmask<slang::ast::LookupFlags>::bitmask(&local_6c,Type);
      local_58 = Lookup::unqualified(in_stack_fffffffffffffff8,in_stack_00000008,unaff_retaddr);
      if ((local_58 != (Symbol *)0x0) && (local_58->kind == NetType)) {
        token.info._0_4_ = in_stack_fffffffffffffd10;
        token._0_8_ = in_stack_fffffffffffffd08;
        token.info._4_4_ = in_stack_fffffffffffffd14;
        getDirection((AnsiPortListBuilder *)in_stack_fffffffffffffd00,token);
        Symbol::as<slang::ast::NetType>((Symbol *)0x4654e9);
        std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                  ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                    *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd08);
        attrs_03._M_extent._M_extent_value = in_stack_fffffffffffffe78._M_extent_value;
        attrs_03._M_ptr = in_stack_fffffffffffffe70;
        pSVar6 = add(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(ArgumentDirection)code_00,
                     (DataTypeSyntax *)in_stack_fffffffffffffe48,
                     (NetType *)in_stack_fffffffffffffe40,attrs_03);
        return pSVar6;
      }
      if ((local_58 == (Symbol *)0x0) || (bVar2 = Symbol::isType((Symbol *)0x46556f), !bVar2)) {
        lookupName._M_str = (char *)local_50[0]._M_len;
        lookupName._M_len = in_stack_ffffffffffffff38;
        Compilation::tryGetDefinition
                  (in_stack_ffffffffffffff30,lookupName,
                   (Scope *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if ((local_b0 != (int *)0x0) && (*local_b0 == 2)) {
          this_00 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x465600);
          if (this_00->definitionKind == Interface) {
            bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x46572c);
            if (bVar2) {
              in_stack_fffffffffffffd80 = *(char **)(in_RDI + 8);
              parsing::Token::location(&local_30->varKeyword);
              Scope::addDiag(in_stack_fffffffffffffda0,code,location);
            }
            bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x465799);
            if (bVar2) {
              in_stack_fffffffffffffd78._M_extent_value = *(size_t *)(in_RDI + 8);
              parsing::Token::location(&local_30->direction);
              Scope::addDiag(in_stack_fffffffffffffda0,code,location);
            }
          }
          else {
            not_null<slang::syntax::DataTypeSyntax_*>::operator->
                      ((not_null<slang::syntax::DataTypeSyntax_*> *)0x46564c);
            slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd50);
            sourceRange.endLoc = in_stack_fffffffffffffe48;
            sourceRange.startLoc = in_stack_fffffffffffffe40;
            Scope::addDiag(local_1d0,code_00,sourceRange);
            arg._M_len._4_4_ = in_stack_fffffffffffffd4c;
            arg._M_len._0_4_ = in_stack_fffffffffffffd48;
            arg._M_str = (char *)in_stack_fffffffffffffd50;
            Diagnostic::operator<<(in_stack_fffffffffffffd40,arg);
            Diagnostic::addNote(in_stack_fffffffffffffd00,in_stack_fffffffffffffd14,
                                in_stack_fffffffffffffd08);
            this_00 = (DefinitionSymbol *)0x0;
          }
          decl_00 = local_28;
          sv((char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
          std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
          span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                    ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                      *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd08
                    );
          modport_00._M_str = in_stack_fffffffffffffd80;
          modport_00._M_len = in_stack_fffffffffffffd78._M_extent_value;
          attrs_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffd98;
          attrs_00._M_ptr = (pointer)in_stack_fffffffffffffd90;
          attrs_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffd9c;
          pSVar6 = add((AnsiPortListBuilder *)this_00,decl_00,in_stack_fffffffffffffd60,modport_00,
                       (bool)isGeneric,attrs_00);
          return pSVar6;
        }
      }
    }
    token_00.info._0_4_ = in_stack_fffffffffffffd10;
    token_00._0_8_ = in_stack_fffffffffffffd08;
    token_00.info._4_4_ = in_stack_fffffffffffffd14;
    AVar3 = getDirection((AnsiPortListBuilder *)in_stack_fffffffffffffd00,token_00);
    bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x4658fe);
    if ((!bVar2) &&
       ((AVar3 == InOut ||
        ((AVar3 != Ref &&
         (pDVar7 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                             ((not_null<slang::syntax::DataTypeSyntax_*> *)0x465927),
         (pDVar7->super_ExpressionSyntax).super_SyntaxNode.kind == ImplicitType)))))) {
      parsing::Token::location(&local_28->name);
      getDefaultNetType((Scope *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        in_stack_fffffffffffffd18);
    }
    not_null::operator_cast_to_DataTypeSyntax_
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x46599c);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd08);
    attrs_04._M_extent._M_extent_value = in_stack_fffffffffffffe78._M_extent_value;
    attrs_04._M_ptr = in_stack_fffffffffffffe70;
    pSVar6 = add(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(ArgumentDirection)code_00,
                 (DataTypeSyntax *)in_stack_fffffffffffffe48,(NetType *)in_stack_fffffffffffffe40,
                 attrs_04);
  }
  return pSVar6;
}

Assistant:

Symbol* createPort(const ImplicitAnsiPortSyntax& syntax) {
        // Helper function to check if an implicit type syntax is totally empty.
        auto isEmpty = [](const DataTypeSyntax& typeSyntax) {
            if (typeSyntax.kind != SyntaxKind::ImplicitType)
                return false;

            const auto& implicitType = typeSyntax.as<ImplicitTypeSyntax>();
            return !implicitType.signing && implicitType.dimensions.empty();
        };

        auto& decl = *syntax.declarator;
        switch (syntax.header->kind) {
            case SyntaxKind::VariablePortHeader: {
                // A VariablePortHeader is parsed as a catch-all when we aren't sure what kind of
                // port this is. There are three components to a port that matter: kind, type,
                // direction. If all three are omitted, inherit them all from the previous port.
                // We'll never even get into this code path if the very first port omitted all three
                // because then it would be a non-ansi port list.
                auto& header = syntax.header->as<VariablePortHeaderSyntax>();
                if (!header.direction && !header.varKeyword && isEmpty(*header.dataType))
                    return addInherited(decl, syntax.attributes);

                // It's possible that this is actually an interface port if the data type is just an
                // identifier. The only way to know is to do a lookup and see what comes back.
                std::string_view simpleName = SyntaxFacts::getSimpleTypeName(*header.dataType);
                if (!simpleName.empty()) {
                    auto found = Lookup::unqualified(scope, simpleName, LookupFlags::Type);
                    if (found && found->kind == SymbolKind::NetType) {
                        return add(decl, getDirection(header.direction), nullptr,
                                   &found->as<NetType>(), syntax.attributes);
                    }

                    // If we didn't find a valid type, try to find a definition.
                    if (!found || !found->isType()) {
                        if (auto def = comp.tryGetDefinition(simpleName, scope).definition;
                            def && def->kind == SymbolKind::Definition) {

                            auto defSym = &def->as<DefinitionSymbol>();
                            if (defSym->definitionKind != DefinitionKind::Interface) {
                                auto& diag = scope.addDiag(diag::PortTypeNotInterfaceOrData,
                                                           header.dataType->sourceRange());
                                diag << defSym->name;
                                diag.addNote(diag::NoteDeclarationHere, defSym->location);
                                defSym = nullptr;
                            }
                            else {
                                if (header.varKeyword) {
                                    scope.addDiag(diag::VarWithInterfacePort,
                                                  header.varKeyword.location());
                                }

                                if (header.direction) {
                                    scope.addDiag(diag::DirectionWithInterfacePort,
                                                  header.direction.location());
                                }
                            }

                            return add(decl, defSym, ""sv, /* isGeneric */ false,
                                       syntax.attributes);
                        }
                    }
                }

                // Rules from [23.2.2.3]:
                // - If we have a var keyword, it's a var
                // - For input and inout, default to a net
                // - For output, if we have a data type it's a var, otherwise net
                // - For ref it's always a var
                //
                // Unfortunately, all major simulators ignore the rule for input ports,
                // and treat them the same as output ports (i.e. it's not a net if there
                // is a data type specified). This is pretty noticeable as otherwise a
                // port like this:
                //    input int i
                // will throw an error because int is not a valid type for a net. Actually
                // noticing the other fact, that it's a net port vs a variable port, is very
                // hard to do, so we go along with everyone else and use the same rule.

                ArgumentDirection direction = getDirection(header.direction);
                const NetType* netType = nullptr;
                if (!header.varKeyword && (direction == ArgumentDirection::InOut ||
                                           (direction != ArgumentDirection::Ref &&
                                            header.dataType->kind == SyntaxKind::ImplicitType))) {
                    netType = &getDefaultNetType(scope, decl.name.location());
                }

                return add(decl, direction, header.dataType, netType, syntax.attributes);
            }
            case SyntaxKind::NetPortHeader: {
                auto& header = syntax.header->as<NetPortHeaderSyntax>();
                return add(decl, getDirection(header.direction), header.dataType,
                           &comp.getNetType(header.netType.kind), syntax.attributes);
            }
            case SyntaxKind::InterfacePortHeader: {
                auto& header = syntax.header->as<InterfacePortHeaderSyntax>();
                if (header.nameOrKeyword.kind == TokenKind::InterfaceKeyword) {
                    std::string_view modport;
                    if (header.modport)
                        modport = header.modport->member.valueText();
                    return add(decl, nullptr, modport, /* isGeneric */ true, syntax.attributes);
                }

                auto [definition, modport] = getInterfacePortInfo(scope, header);
                return add(decl, definition, modport, /* isGeneric */ false, syntax.attributes);
            }
            default:
                SLANG_UNREACHABLE;
        }
    }